

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCutGeneration.cpp
# Opt level: O1

bool __thiscall
HighsCutGeneration::preprocessBaseInequality
          (HighsCutGeneration *this,bool *hasUnboundedInts,bool *hasGeneralInts,bool *hasContinuous)

{
  pointer pdVar1;
  double *pdVar2;
  pointer puVar3;
  double dVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  bool bVar5;
  long lVar6;
  long lVar7;
  bool *__len;
  ulong uVar8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar9;
  ulong uVar10;
  uint uVar11;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __i;
  int *piVar13;
  int iVar14;
  undefined4 uVar15;
  double dVar16;
  double dVar17;
  vector<int,_std::allocator<int>_> cancelNzs;
  int expshift;
  int local_9c;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_98;
  bool *local_90;
  uint local_84;
  int local_80;
  int local_7c;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  iterator iStack_70;
  int *local_68;
  undefined1 local_58 [16];
  ulong local_40;
  int local_34;
  int iVar12;
  
  *hasUnboundedInts = false;
  *hasContinuous = false;
  *hasGeneralInts = false;
  local_58._0_8_ = (ulong)this->feastol ^ 0x8000000000000000;
  local_58._8_4_ = 0;
  local_58._12_4_ = 0x80000000;
  if ((long)this->rowlen < 1) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = 0.0;
    lVar7 = 0;
    do {
      if (dVar4 <= ABS(this->vals[lVar7])) {
        dVar4 = ABS(this->vals[lVar7]);
      }
      lVar7 = lVar7 + 1;
    } while (this->rowlen != lVar7);
  }
  local_34 = 0;
  local_90 = hasContinuous;
  frexp(dVar4,&local_34);
  iVar12 = -local_34;
  local_34 = iVar12;
  dVar4 = ldexp(1.0,iVar12);
  this->initialScale = dVar4;
  HighsCDouble::operator*=(&this->rhs,dVar4);
  iVar14 = this->rowlen;
  if (0 < iVar14) {
    lVar7 = 0;
    do {
      dVar4 = ldexp(this->vals[lVar7],iVar12);
      this->vals[lVar7] = dVar4;
      lVar7 = lVar7 + 1;
      iVar14 = this->rowlen;
    } while (lVar7 < iVar14);
  }
  pvVar9 = &this->isintegral;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(pvVar9,(long)iVar14);
  if (this->rowlen == 0) {
    iVar14 = 0;
  }
  else {
    local_98 = &this->complementation;
    uVar8 = 0;
    iVar14 = 0;
    do {
      bVar5 = HighsLpRelaxation::isColIntegral(this->lpRelaxation,this->inds[uVar8]);
      if (bVar5) {
        bVar5 = this->feastol * 10.0 < ABS(this->vals[uVar8]);
      }
      else {
        bVar5 = false;
      }
      (pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start[uVar8] = bVar5;
      if ((pvVar9->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar8] == '\0') {
        dVar4 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8];
        dVar4 = dVar4 + dVar4;
        pdVar2 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8;
        if (*pdVar2 <= dVar4 && dVar4 != *pdVar2) {
          if ((this->complementation).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
              (this->complementation).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                      (local_98,(long)this->rowlen);
          }
          flipComplementation(this,(HighsInt)uVar8);
        }
        pdVar2 = this->vals;
        dVar4 = pdVar2[uVar8];
        if ((0.0 < dVar4) ||
           (ABS(dVar4) *
            (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[uVar8] <= this->feastol * 10.0)) {
          if (dVar4 < 0.0) {
            dVar16 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar8];
            if (INFINITY <= dVar16) {
              return false;
            }
            dVar4 = dVar4 * dVar16;
            dVar16 = (this->rhs).hi;
            dVar17 = dVar16 - dVar4;
            (this->rhs).hi = dVar17;
            (this->rhs).lo =
                 (dVar16 - (dVar4 + dVar17)) + (-dVar4 - (dVar17 - (dVar4 + dVar17))) +
                 (this->rhs).lo;
          }
          iVar14 = iVar14 + 1;
          pdVar2[uVar8] = 0.0;
        }
        else {
          *local_90 = true;
        }
      }
      else {
        dVar4 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar8];
        if (dVar4 < INFINITY) {
          if ((dVar4 != 1.0) || (NAN(dVar4))) goto LAB_00284b40;
        }
        else {
          *hasUnboundedInts = true;
LAB_00284b40:
          *hasGeneralInts = true;
        }
        if (0.0 < this->vals[uVar8]) {
          uVar15 = local_58._12_4_;
          local_58._8_4_ = local_58._8_4_;
          local_58._0_8_ = local_58._0_8_ + this->vals[uVar8] * dVar4;
          local_58._12_4_ = uVar15;
        }
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)this->rowlen);
  }
  local_7c = (int)((double)(this->lpRelaxation->lpsolver).model_.lp_.num_col_ * 0.15 + 100.0);
  lVar7 = (long)this->rowlen - (long)iVar14;
  iVar12 = (int)lVar7;
  uVar11 = iVar12 - local_7c;
  if (uVar11 != 0 && local_7c <= iVar12) {
    local_78._M_current = (int *)0x0;
    iStack_70._M_current = (int *)0x0;
    local_68 = (int *)0x0;
    local_9c = 0;
    if (this->rowlen != 0) {
      do {
        lVar6 = (long)local_9c;
        if (this->vals[lVar6] <= 0.0) {
          dVar4 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6] -
                  (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
        }
        else {
          dVar4 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar6];
        }
        if (dVar4 <= this->feastol) {
          if (iStack_70._M_current == local_68) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_78,iStack_70,&local_9c);
          }
          else {
            *iStack_70._M_current = local_9c;
            iStack_70._M_current = iStack_70._M_current + 1;
          }
        }
        local_9c = local_9c + 1;
      } while (local_9c != this->rowlen);
    }
    __first._M_current = local_78._M_current;
    uVar8 = (ulong)((long)iStack_70._M_current - (long)local_78._M_current) >> 2;
    if ((int)uVar11 <= (int)uVar8) {
      if ((int)uVar11 < (int)uVar8) {
        local_98 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)iStack_70._M_current;
        local_90 = (bool *)(long)(int)uVar11;
        piVar13 = local_78._M_current + (long)local_90;
        local_84 = uVar11;
        local_80 = iVar14;
        local_40 = uVar8;
        if (1 < (int)uVar11) {
          lVar6 = (long)(local_90 + (-2 - ((long)(local_90 + -2) >> 0x3f))) >> 1;
          do {
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                      (__first,lVar6,(long)local_90,__first._M_current[lVar6],
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
                        )this);
            bVar5 = lVar6 != 0;
            lVar6 = lVar6 + -1;
          } while (bVar5);
        }
        uVar8 = local_40;
        iVar14 = local_80;
        __len = local_90;
        pvVar9 = local_98;
        if (piVar13 < local_98) {
          do {
            iVar12 = *piVar13;
            if (ABS(this->vals[iVar12]) < ABS(this->vals[*__first._M_current])) {
              *piVar13 = *__first._M_current;
              std::
              __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                        (__first,0,(long)__len,iVar12,
                         (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
                          )this);
              __len = local_90;
              pvVar9 = local_98;
            }
            piVar13 = piVar13 + 1;
          } while (piVar13 < pvVar9);
        }
        uVar11 = local_84;
        if (1 < (int)local_84) {
          lVar7 = lVar7 * 4 + (long)local_7c * -4;
          do {
            lVar7 = lVar7 + -4;
            iVar12 = *(__first._M_current + lVar7);
            *(__first._M_current + lVar7) = *__first._M_current;
            std::
            __adjust_heap<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,int,__gnu_cxx::__ops::_Iter_comp_iter<HighsCutGeneration::preprocessBaseInequality(bool&,bool&,bool&)::__0>>
                      (__first,0,lVar7 >> 2,iVar12,
                       (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_coin_or[P]HiGHS_src_mip_HighsCutGeneration_cpp:974:42)>
                        )this);
          } while (4 < lVar7);
        }
      }
      if (0 < (int)uVar11) {
        pdVar1 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pdVar2 = this->vals;
        uVar10 = 0;
        do {
          iVar12 = local_78._M_current[uVar10];
          dVar4 = pdVar2[iVar12];
          dVar16 = dVar4 * pdVar1[iVar12];
          if (0.0 <= dVar4) {
            local_58._0_8_ = (double)local_58._0_8_ - dVar16;
          }
          else {
            dVar4 = (this->rhs).hi;
            dVar17 = dVar4 - dVar16;
            (this->rhs).hi = dVar17;
            (this->rhs).lo =
                 (dVar4 - (dVar16 + dVar17)) + (-dVar16 - (dVar17 - (dVar16 + dVar17))) +
                 (this->rhs).lo;
          }
          pdVar2[iVar12] = 0.0;
          uVar10 = uVar10 + 1;
        } while (uVar10 < uVar11);
      }
      iVar14 = iVar14 + uVar11;
    }
    if (local_78._M_current != (int *)0x0) {
      operator_delete(local_78._M_current);
    }
    if ((int)uVar8 < (int)uVar11) {
      return false;
    }
  }
  if (iVar14 != 0) {
    uVar11 = this->rowlen;
    if ((this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        (this->complementation).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      if (0 < (int)uVar11) {
        lVar7 = (ulong)uVar11 + 1;
        do {
          pdVar2 = this->vals;
          if ((pdVar2[lVar7 + -2] == 0.0) && (!NAN(pdVar2[lVar7 + -2]))) {
            iVar12 = this->rowlen;
            this->rowlen = iVar12 + -1;
            this->inds[lVar7 + -2] = this->inds[(long)iVar12 + -1];
            iVar12 = this->rowlen;
            pdVar2[lVar7 + -2] = pdVar2[iVar12];
            pdVar1 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar1[lVar7 + -2] = pdVar1[iVar12];
            pdVar1 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar1[lVar7 + -2] = pdVar1[iVar12];
            puVar3 = (this->isintegral).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
            puVar3[lVar7 + -2] = puVar3[iVar12];
            iVar14 = iVar14 + -1;
            if (iVar14 == 0) break;
          }
          lVar7 = lVar7 + -1;
        } while (1 < lVar7);
      }
    }
    else if (0 < (int)uVar11) {
      lVar7 = (ulong)uVar11 + 1;
      do {
        pdVar2 = this->vals;
        if ((pdVar2[lVar7 + -2] == 0.0) && (!NAN(pdVar2[lVar7 + -2]))) {
          iVar12 = this->rowlen;
          this->rowlen = iVar12 + -1;
          this->inds[lVar7 + -2] = this->inds[(long)iVar12 + -1];
          iVar12 = this->rowlen;
          pdVar2[lVar7 + -2] = pdVar2[iVar12];
          pdVar1 = (this->upper).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[lVar7 + -2] = pdVar1[iVar12];
          pdVar1 = (this->solval).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar1[lVar7 + -2] = pdVar1[iVar12];
          puVar3 = (this->isintegral).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3[lVar7 + -2] = puVar3[iVar12];
          puVar3 = (this->complementation).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          puVar3[lVar7 + -2] = puVar3[this->rowlen];
          iVar14 = iVar14 + -1;
          if (iVar14 == 0) break;
        }
        lVar7 = lVar7 + -1;
      } while (1 < lVar7);
    }
  }
  return (this->rhs).hi + (this->rhs).lo < (double)local_58._0_8_;
}

Assistant:

bool HighsCutGeneration::preprocessBaseInequality(bool& hasUnboundedInts,
                                                  bool& hasGeneralInts,
                                                  bool& hasContinuous) {
  // preprocess the inequality before cut generation
  // 1. Determine the maximal activity to check for trivial redundancy and
  // tighten coefficients
  // 2. Check for presence of continuous variables and unbounded integers as not
  // all methods for cut generation are applicable in that case
  // 3. Remove coefficients that are below the feasibility tolerance to avoid
  // numerical troubles, use bound constraints to cancel them and
  // reject base inequalities where that is not possible due to unbounded
  // variables
  hasUnboundedInts = false;
  hasContinuous = false;
  hasGeneralInts = false;
  HighsInt numZeros = 0;

  double maxact = -feastol;
  double maxAbsVal = 0;
  for (HighsInt i = 0; i < rowlen; ++i)
    maxAbsVal = std::max(std::abs(vals[i]), maxAbsVal);

  int expshift = 0;
  std::frexp(maxAbsVal, &expshift);
  expshift = -expshift;
  initialScale = std::ldexp(1.0, expshift);
  rhs *= initialScale;
  for (HighsInt i = 0; i < rowlen; ++i) vals[i] = std::ldexp(vals[i], expshift);

  isintegral.resize(rowlen);
  for (HighsInt i = 0; i != rowlen; ++i) {
    // we do not want to have integral variables with small coefficients as this
    // may lead to numerical instabilities during cut generation
    // Therefore we relax integral variables with small coefficients to
    // continuous ones because they still might have a non-negligible
    // contribution e.g. when they come from integral rows with coefficients on
    // the larger side. When we relax them to continuous variables they will be
    // complemented so that their solution value is closest to zero and then
    // will be relaxed if their value is positive or their maximal contribution
    // is below feasibility tolerance.
    isintegral[i] =
        lpRelaxation.isColIntegral(inds[i]) && std::abs(vals[i]) > 10 * feastol;

    if (!isintegral[i]) {
      // complement non-integer variable (cmir separation heuristic complements
      // integral variables in the same way)
      if (upper[i] < 2 * solval[i]) {
        if (complementation.empty()) complementation.resize(rowlen);

        flipComplementation(i);
      }

      // relax positive continuous variables and those with small contributions
      if (vals[i] > 0 || std::abs(vals[i]) * upper[i] <= 10 * feastol) {
        // printf("remove: vals[i] = %g  upper[i] = %g\n", vals[i], upper[i]);
        if (vals[i] < 0) {
          if (upper[i] == kHighsInf) return false;
          rhs -= vals[i] * upper[i];
        }

        ++numZeros;
        vals[i] = 0.0;
        continue;
      }

      hasContinuous = true;
      // if (lpRelaxation.isColIntegral(inds[i]))
      //   printf("vals[i] = %g  upper[i] = %g\n", vals[i], upper[i]);

      if (vals[i] > 0) {
        if (upper[i] == kHighsInf)
          maxact = kHighsInf;
        else
          maxact += vals[i] * upper[i];
      }
    } else {
      if (upper[i] == kHighsInf) {
        hasUnboundedInts = true;
        hasGeneralInts = true;
      } else if (upper[i] != 1.0) {
        hasGeneralInts = true;
      }

      if (vals[i] > 0) maxact += vals[i] * upper[i];
    }
  }

  HighsInt maxLen = 100 + 0.15 * (lpRelaxation.numCols());

  if (rowlen - numZeros > maxLen) {
    HighsInt numCancel = rowlen - numZeros - maxLen;
    std::vector<HighsInt> cancelNzs;

    for (HighsInt i = 0; i != rowlen; ++i) {
      double cancelSlack = vals[i] > 0 ? solval[i] : upper[i] - solval[i];
      if (cancelSlack <= feastol) cancelNzs.push_back(i);
    }

    if ((HighsInt)cancelNzs.size() < numCancel) return false;
    if ((HighsInt)cancelNzs.size() > numCancel)
      std::partial_sort(cancelNzs.begin(), cancelNzs.begin() + numCancel,
                        cancelNzs.end(), [&](HighsInt a, HighsInt b) {
                          return std::abs(vals[a]) < std::abs(vals[b]);
                        });

    for (HighsInt i = 0; i < numCancel; ++i) {
      HighsInt j = cancelNzs[i];

      if (vals[j] < 0) {
        rhs -= vals[j] * upper[j];
      } else
        maxact -= vals[j] * upper[j];

      vals[j] = 0.0;
    }

    numZeros += numCancel;
  }

  if (numZeros != 0) {
    // remove zeros in place
    if (complementation.empty()) {
      for (HighsInt i = rowlen - 1; i >= 0; --i) {
        if (vals[i] == 0.0) {
          --rowlen;
          inds[i] = inds[rowlen];
          vals[i] = vals[rowlen];
          upper[i] = upper[rowlen];
          solval[i] = solval[rowlen];
          isintegral[i] = isintegral[rowlen];
          if (--numZeros == 0) break;
        }
      }
    } else {
      for (HighsInt i = rowlen - 1; i >= 0; --i) {
        if (vals[i] == 0.0) {
          --rowlen;
          inds[i] = inds[rowlen];
          vals[i] = vals[rowlen];
          upper[i] = upper[rowlen];
          solval[i] = solval[rowlen];
          isintegral[i] = isintegral[rowlen];
          complementation[i] = complementation[rowlen];
          if (--numZeros == 0) break;
        }
      }
    }
  }

  return maxact > rhs;
}